

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O1

void BZ2_compressBlock(EState *s,Bool is_last_block)

{
  UChar (*paUVar1) [258];
  short *psVar2;
  UChar UVar3;
  UChar UVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined4 *puVar80;
  undefined8 uVar81;
  size_t __n;
  byte bVar82;
  int iVar83;
  uint uVar84;
  int iVar85;
  long lVar86;
  UInt32 *pUVar87;
  char cVar88;
  byte bVar89;
  UChar UVar90;
  uint uVar91;
  uint uVar92;
  ulong uVar93;
  uint uVar94;
  long lVar95;
  UInt16 *pUVar96;
  ulong uVar97;
  Bool *pBVar98;
  ulong uVar99;
  Int32 (*paIVar100) [258];
  undefined7 in_register_00000031;
  ulong uVar101;
  UChar *pUVar102;
  UChar (*paUVar103) [258];
  uint uVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  int iVar118;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  int iVar120;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  long lVar119;
  undefined1 auVar117 [16];
  int iVar124;
  long lVar125;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  int iVar167;
  int iVar171;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  UInt16 cost [6];
  Int32 fave [6];
  UChar local_1d8 [24];
  UInt16 *local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [16];
  int local_194;
  int local_190;
  int local_18c;
  Int32 (*local_188) [258];
  ulong local_180;
  ulong local_178;
  undefined4 local_16c;
  Bool *local_168;
  UInt32 *local_160;
  size_t local_158;
  size_t local_150;
  UChar (*local_148) [258];
  ulong local_140;
  undefined4 local_138;
  char acStack_134 [260];
  
  if (0 < s->nblock) {
    uVar84 = s->blockCRC;
    s->blockCRC = ~uVar84;
    s->combinedCRC = (s->combinedCRC << 1 | (uint)((int)s->combinedCRC < 0)) ^ ~uVar84;
    if (1 < s->blockNo) {
      s->numZ = 0;
    }
    if (1 < s->verbosity) {
      fprintf(_stderr,"    block %d: crc = 0x%08x, combined CRC = 0x%08x, size = %d\n");
    }
    BZ2_blockSort(s);
  }
  s->zbits = (UChar *)((long)s->nblock + (long)s->arr2);
  if (s->blockNo == 1) {
    s->bsBuff = 0;
    s->bsLive = 0;
    bsPutUChar(s,'B');
    bsPutUChar(s,'Z');
    bsPutUChar(s,'h');
    bsPutUChar(s,(char)s->blockSize100k + '0');
  }
  if (s->nblock < 1) goto LAB_0010a537;
  bsPutUChar(s,'1');
  bsPutUChar(s,'A');
  bsPutUChar(s,'Y');
  bsPutUChar(s,'&');
  bsPutUChar(s,'S');
  bsPutUChar(s,'Y');
  bsPutUInt32(s,s->blockCRC);
  iVar83 = s->bsLive;
  if (7 < iVar83) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar118 = s->bsLive;
      iVar83 = iVar118 + -8;
      s->bsLive = iVar83;
    } while (0xf < iVar118);
  }
  local_16c = (int)CONCAT71(in_register_00000031,is_last_block);
  iVar83 = iVar83 + 1;
  s->bsLive = iVar83;
  iVar118 = s->origPtr;
  if (7 < iVar83) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar120 = s->bsLive;
      iVar83 = iVar120 + -8;
      s->bsLive = iVar83;
    } while (0xf < iVar120);
  }
  s->bsBuff = s->bsBuff | iVar118 << (8U - (char)iVar83 & 0x1f);
  s->bsLive = iVar83 + 0x18;
  pUVar87 = s->ptr;
  pUVar102 = s->block;
  local_1c0 = s->mtfv;
  s->nInUse = 0;
  lVar86 = -0x100;
  do {
    if (s->unseqToSeq[lVar86] != '\0') {
      iVar83 = s->nInUse;
      *(char *)((long)s->mtfFreq + lVar86 + -0x20) = (char)iVar83;
      s->nInUse = iVar83 + 1;
    }
    lVar86 = lVar86 + 1;
  } while (lVar86 != 0);
  iVar83 = s->nInUse;
  lVar86 = (long)iVar83;
  if (-2 < lVar86) {
    memset(s->mtfFreq,0,(ulong)(iVar83 + 2) << 2);
  }
  if (0 < iVar83) {
    lVar95 = lVar86 + -1;
    local_1a8._8_4_ = (int)lVar95;
    local_1a8._0_8_ = lVar95;
    local_1a8._12_4_ = (int)((ulong)lVar95 >> 0x20);
    uVar93 = 0;
    auVar108 = local_1a8;
    auVar128 = _DAT_00111bf0;
    auVar126 = _DAT_00111c00;
    auVar131 = _DAT_00111c10;
    in_XMM4 = _DAT_00111c20;
    auVar139 = _DAT_00111c30;
    auVar140 = _DAT_00111c40;
    auVar141 = _DAT_00111c50;
    auVar142 = _DAT_00111c60;
    do {
      auVar152 = local_1a8 ^ _DAT_00111c70;
      auVar154 = auVar142 ^ _DAT_00111c70;
      iVar118 = auVar152._0_4_;
      iVar167 = -(uint)(iVar118 < auVar154._0_4_);
      iVar120 = auVar152._4_4_;
      auVar156._4_4_ = -(uint)(iVar120 < auVar154._4_4_);
      iVar85 = auVar152._8_4_;
      iVar171 = -(uint)(iVar85 < auVar154._8_4_);
      iVar124 = auVar152._12_4_;
      auVar156._12_4_ = -(uint)(iVar124 < auVar154._12_4_);
      auVar152._4_4_ = iVar167;
      auVar152._0_4_ = iVar167;
      auVar152._8_4_ = iVar171;
      auVar152._12_4_ = iVar171;
      auVar152 = pshuflw(auVar108,auVar152,0xe8);
      auVar155._4_4_ = -(uint)(auVar154._4_4_ == iVar120);
      auVar155._12_4_ = -(uint)(auVar154._12_4_ == iVar124);
      auVar155._0_4_ = auVar155._4_4_;
      auVar155._8_4_ = auVar155._12_4_;
      auVar143 = pshuflw(in_XMM11,auVar155,0xe8);
      auVar156._0_4_ = auVar156._4_4_;
      auVar156._8_4_ = auVar156._12_4_;
      auVar154 = pshuflw(auVar152,auVar156,0xe8);
      auVar108._8_4_ = 0xffffffff;
      auVar108._0_8_ = 0xffffffffffffffff;
      auVar108._12_4_ = 0xffffffff;
      auVar108 = (auVar154 | auVar143 & auVar152) ^ auVar108;
      auVar108 = packssdw(auVar108,auVar108);
      cVar88 = (char)uVar93;
      if ((auVar108 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_138 + uVar93) = cVar88;
      }
      auVar143._4_4_ = iVar167;
      auVar143._0_4_ = iVar167;
      auVar143._8_4_ = iVar171;
      auVar143._12_4_ = iVar171;
      auVar156 = auVar155 & auVar143 | auVar156;
      auVar108 = packssdw(auVar156,auVar156);
      auVar154._8_4_ = 0xffffffff;
      auVar154._0_8_ = 0xffffffffffffffff;
      auVar154._12_4_ = 0xffffffff;
      auVar108 = packssdw(auVar108 ^ auVar154,auVar108 ^ auVar154);
      auVar108 = packsswb(auVar108,auVar108);
      if ((auVar108._0_4_ >> 8 & 1) != 0) {
        *(char *)((long)&local_138 + uVar93 + 1) = cVar88 + '\x01';
      }
      auVar108 = auVar141 ^ _DAT_00111c70;
      auVar144._0_4_ = -(uint)(iVar118 < auVar108._0_4_);
      auVar144._4_4_ = -(uint)(iVar120 < auVar108._4_4_);
      auVar144._8_4_ = -(uint)(iVar85 < auVar108._8_4_);
      auVar144._12_4_ = -(uint)(iVar124 < auVar108._12_4_);
      auVar157._4_4_ = auVar144._0_4_;
      auVar157._0_4_ = auVar144._0_4_;
      auVar157._8_4_ = auVar144._8_4_;
      auVar157._12_4_ = auVar144._8_4_;
      iVar167 = -(uint)(auVar108._4_4_ == iVar120);
      iVar171 = -(uint)(auVar108._12_4_ == iVar124);
      auVar65._4_4_ = iVar167;
      auVar65._0_4_ = iVar167;
      auVar65._8_4_ = iVar171;
      auVar65._12_4_ = iVar171;
      auVar168._4_4_ = auVar144._4_4_;
      auVar168._0_4_ = auVar144._4_4_;
      auVar168._8_4_ = auVar144._12_4_;
      auVar168._12_4_ = auVar144._12_4_;
      auVar108 = auVar65 & auVar157 | auVar168;
      auVar108 = packssdw(auVar108,auVar108);
      auVar56._8_4_ = 0xffffffff;
      auVar56._0_8_ = 0xffffffffffffffff;
      auVar56._12_4_ = 0xffffffff;
      auVar108 = packssdw(auVar108 ^ auVar56,auVar108 ^ auVar56);
      auVar108 = packsswb(auVar108,auVar108);
      if ((auVar108._0_4_ >> 0x10 & 1) != 0) {
        *(char *)((long)&local_138 + uVar93 + 2) = cVar88 + '\x02';
      }
      auVar108 = pshufhw(auVar108,auVar157,0x84);
      auVar66._4_4_ = iVar167;
      auVar66._0_4_ = iVar167;
      auVar66._8_4_ = iVar171;
      auVar66._12_4_ = iVar171;
      auVar154 = pshufhw(auVar144,auVar66,0x84);
      auVar152 = pshufhw(auVar108,auVar168,0x84);
      auVar109._8_4_ = 0xffffffff;
      auVar109._0_8_ = 0xffffffffffffffff;
      auVar109._12_4_ = 0xffffffff;
      auVar109 = (auVar152 | auVar154 & auVar108) ^ auVar109;
      auVar108 = packssdw(auVar109,auVar109);
      auVar108 = packsswb(auVar108,auVar108);
      if ((auVar108._0_4_ >> 0x18 & 1) != 0) {
        *(char *)((long)&local_138 + uVar93 + 3) = cVar88 + '\x03';
      }
      auVar108 = auVar140 ^ _DAT_00111c70;
      auVar145._0_4_ = -(uint)(iVar118 < auVar108._0_4_);
      auVar145._4_4_ = -(uint)(iVar120 < auVar108._4_4_);
      auVar145._8_4_ = -(uint)(iVar85 < auVar108._8_4_);
      auVar145._12_4_ = -(uint)(iVar124 < auVar108._12_4_);
      auVar67._4_4_ = auVar145._0_4_;
      auVar67._0_4_ = auVar145._0_4_;
      auVar67._8_4_ = auVar145._8_4_;
      auVar67._12_4_ = auVar145._8_4_;
      auVar154 = pshuflw(auVar168,auVar67,0xe8);
      auVar110._0_4_ = -(uint)(auVar108._0_4_ == iVar118);
      auVar110._4_4_ = -(uint)(auVar108._4_4_ == iVar120);
      auVar110._8_4_ = -(uint)(auVar108._8_4_ == iVar85);
      auVar110._12_4_ = -(uint)(auVar108._12_4_ == iVar124);
      auVar158._4_4_ = auVar110._4_4_;
      auVar158._0_4_ = auVar110._4_4_;
      auVar158._8_4_ = auVar110._12_4_;
      auVar158._12_4_ = auVar110._12_4_;
      auVar108 = pshuflw(auVar110,auVar158,0xe8);
      auVar159._4_4_ = auVar145._4_4_;
      auVar159._0_4_ = auVar145._4_4_;
      auVar159._8_4_ = auVar145._12_4_;
      auVar159._12_4_ = auVar145._12_4_;
      auVar152 = pshuflw(auVar145,auVar159,0xe8);
      auVar57._8_4_ = 0xffffffff;
      auVar57._0_8_ = 0xffffffffffffffff;
      auVar57._12_4_ = 0xffffffff;
      auVar108 = packssdw(auVar108 & auVar154,(auVar152 | auVar108 & auVar154) ^ auVar57);
      auVar108 = packsswb(auVar108,auVar108);
      if ((auVar108 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        acStack_134[uVar93] = cVar88 + '\x04';
      }
      auVar68._4_4_ = auVar145._0_4_;
      auVar68._0_4_ = auVar145._0_4_;
      auVar68._8_4_ = auVar145._8_4_;
      auVar68._12_4_ = auVar145._8_4_;
      auVar159 = auVar158 & auVar68 | auVar159;
      auVar152 = packssdw(auVar159,auVar159);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar108 = packssdw(auVar108,auVar152 ^ auVar58);
      auVar108 = packsswb(auVar108,auVar108);
      if ((auVar108._4_2_ >> 8 & 1) != 0) {
        acStack_134[uVar93 + 1] = cVar88 + '\x05';
      }
      auVar108 = auVar139 ^ _DAT_00111c70;
      auVar146._0_4_ = -(uint)(iVar118 < auVar108._0_4_);
      auVar146._4_4_ = -(uint)(iVar120 < auVar108._4_4_);
      auVar146._8_4_ = -(uint)(iVar85 < auVar108._8_4_);
      auVar146._12_4_ = -(uint)(iVar124 < auVar108._12_4_);
      auVar160._4_4_ = auVar146._0_4_;
      auVar160._0_4_ = auVar146._0_4_;
      auVar160._8_4_ = auVar146._8_4_;
      auVar160._12_4_ = auVar146._8_4_;
      iVar167 = -(uint)(auVar108._4_4_ == iVar120);
      iVar171 = -(uint)(auVar108._12_4_ == iVar124);
      auVar69._4_4_ = iVar167;
      auVar69._0_4_ = iVar167;
      auVar69._8_4_ = iVar171;
      auVar69._12_4_ = iVar171;
      auVar169._4_4_ = auVar146._4_4_;
      auVar169._0_4_ = auVar146._4_4_;
      auVar169._8_4_ = auVar146._12_4_;
      auVar169._12_4_ = auVar146._12_4_;
      auVar108 = auVar69 & auVar160 | auVar169;
      auVar108 = packssdw(auVar108,auVar108);
      auVar59._8_4_ = 0xffffffff;
      auVar59._0_8_ = 0xffffffffffffffff;
      auVar59._12_4_ = 0xffffffff;
      auVar108 = packssdw(auVar108 ^ auVar59,auVar108 ^ auVar59);
      auVar108 = packsswb(auVar108,auVar108);
      if ((auVar108 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        acStack_134[uVar93 + 2] = cVar88 + '\x06';
      }
      auVar108 = pshufhw(auVar108,auVar160,0x84);
      auVar70._4_4_ = iVar167;
      auVar70._0_4_ = iVar167;
      auVar70._8_4_ = iVar171;
      auVar70._12_4_ = iVar171;
      auVar154 = pshufhw(auVar146,auVar70,0x84);
      auVar152 = pshufhw(auVar108,auVar169,0x84);
      auVar111._8_4_ = 0xffffffff;
      auVar111._0_8_ = 0xffffffffffffffff;
      auVar111._12_4_ = 0xffffffff;
      auVar111 = (auVar152 | auVar154 & auVar108) ^ auVar111;
      auVar108 = packssdw(auVar111,auVar111);
      auVar108 = packsswb(auVar108,auVar108);
      if ((auVar108._6_2_ >> 8 & 1) != 0) {
        acStack_134[uVar93 + 3] = cVar88 + '\a';
      }
      auVar108 = in_XMM4 ^ _DAT_00111c70;
      auVar147._0_4_ = -(uint)(iVar118 < auVar108._0_4_);
      auVar147._4_4_ = -(uint)(iVar120 < auVar108._4_4_);
      auVar147._8_4_ = -(uint)(iVar85 < auVar108._8_4_);
      auVar147._12_4_ = -(uint)(iVar124 < auVar108._12_4_);
      auVar71._4_4_ = auVar147._0_4_;
      auVar71._0_4_ = auVar147._0_4_;
      auVar71._8_4_ = auVar147._8_4_;
      auVar71._12_4_ = auVar147._8_4_;
      auVar154 = pshuflw(auVar169,auVar71,0xe8);
      auVar112._0_4_ = -(uint)(auVar108._0_4_ == iVar118);
      auVar112._4_4_ = -(uint)(auVar108._4_4_ == iVar120);
      auVar112._8_4_ = -(uint)(auVar108._8_4_ == iVar85);
      auVar112._12_4_ = -(uint)(auVar108._12_4_ == iVar124);
      auVar161._4_4_ = auVar112._4_4_;
      auVar161._0_4_ = auVar112._4_4_;
      auVar161._8_4_ = auVar112._12_4_;
      auVar161._12_4_ = auVar112._12_4_;
      auVar108 = pshuflw(auVar112,auVar161,0xe8);
      auVar162._4_4_ = auVar147._4_4_;
      auVar162._0_4_ = auVar147._4_4_;
      auVar162._8_4_ = auVar147._12_4_;
      auVar162._12_4_ = auVar147._12_4_;
      auVar152 = pshuflw(auVar147,auVar162,0xe8);
      auVar148._8_4_ = 0xffffffff;
      auVar148._0_8_ = 0xffffffffffffffff;
      auVar148._12_4_ = 0xffffffff;
      auVar148 = (auVar152 | auVar108 & auVar154) ^ auVar148;
      auVar152 = packssdw(auVar148,auVar148);
      auVar108 = packsswb(auVar108 & auVar154,auVar152);
      if ((auVar108 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        acStack_134[uVar93 + 4] = cVar88 + '\b';
      }
      auVar72._4_4_ = auVar147._0_4_;
      auVar72._0_4_ = auVar147._0_4_;
      auVar72._8_4_ = auVar147._8_4_;
      auVar72._12_4_ = auVar147._8_4_;
      auVar162 = auVar161 & auVar72 | auVar162;
      auVar152 = packssdw(auVar162,auVar162);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar152 = packssdw(auVar152 ^ auVar60,auVar152 ^ auVar60);
      auVar108 = packsswb(auVar108,auVar152);
      if ((auVar108._8_2_ >> 8 & 1) != 0) {
        acStack_134[uVar93 + 5] = cVar88 + '\t';
      }
      auVar108 = auVar131 ^ _DAT_00111c70;
      auVar149._0_4_ = -(uint)(iVar118 < auVar108._0_4_);
      auVar149._4_4_ = -(uint)(iVar120 < auVar108._4_4_);
      auVar149._8_4_ = -(uint)(iVar85 < auVar108._8_4_);
      auVar149._12_4_ = -(uint)(iVar124 < auVar108._12_4_);
      auVar163._4_4_ = auVar149._0_4_;
      auVar163._0_4_ = auVar149._0_4_;
      auVar163._8_4_ = auVar149._8_4_;
      auVar163._12_4_ = auVar149._8_4_;
      iVar167 = -(uint)(auVar108._4_4_ == iVar120);
      iVar171 = -(uint)(auVar108._12_4_ == iVar124);
      auVar73._4_4_ = iVar167;
      auVar73._0_4_ = iVar167;
      auVar73._8_4_ = iVar171;
      auVar73._12_4_ = iVar171;
      auVar170._4_4_ = auVar149._4_4_;
      auVar170._0_4_ = auVar149._4_4_;
      auVar170._8_4_ = auVar149._12_4_;
      auVar170._12_4_ = auVar149._12_4_;
      auVar108 = auVar73 & auVar163 | auVar170;
      auVar108 = packssdw(auVar108,auVar108);
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar108 = packssdw(auVar108 ^ auVar61,auVar108 ^ auVar61);
      auVar108 = packsswb(auVar108,auVar108);
      if ((auVar108 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        acStack_134[uVar93 + 6] = cVar88 + '\n';
      }
      auVar108 = pshufhw(auVar108,auVar163,0x84);
      auVar74._4_4_ = iVar167;
      auVar74._0_4_ = iVar167;
      auVar74._8_4_ = iVar171;
      auVar74._12_4_ = iVar171;
      auVar154 = pshufhw(auVar149,auVar74,0x84);
      auVar152 = pshufhw(auVar108,auVar170,0x84);
      auVar113._8_4_ = 0xffffffff;
      auVar113._0_8_ = 0xffffffffffffffff;
      auVar113._12_4_ = 0xffffffff;
      auVar113 = (auVar152 | auVar154 & auVar108) ^ auVar113;
      auVar108 = packssdw(auVar113,auVar113);
      auVar108 = packsswb(auVar108,auVar108);
      if ((auVar108._10_2_ >> 8 & 1) != 0) {
        acStack_134[uVar93 + 7] = cVar88 + '\v';
      }
      auVar108 = auVar126 ^ _DAT_00111c70;
      auVar150._0_4_ = -(uint)(iVar118 < auVar108._0_4_);
      auVar150._4_4_ = -(uint)(iVar120 < auVar108._4_4_);
      auVar150._8_4_ = -(uint)(iVar85 < auVar108._8_4_);
      auVar150._12_4_ = -(uint)(iVar124 < auVar108._12_4_);
      auVar75._4_4_ = auVar150._0_4_;
      auVar75._0_4_ = auVar150._0_4_;
      auVar75._8_4_ = auVar150._8_4_;
      auVar75._12_4_ = auVar150._8_4_;
      auVar154 = pshuflw(auVar170,auVar75,0xe8);
      auVar114._0_4_ = -(uint)(auVar108._0_4_ == iVar118);
      auVar114._4_4_ = -(uint)(auVar108._4_4_ == iVar120);
      auVar114._8_4_ = -(uint)(auVar108._8_4_ == iVar85);
      auVar114._12_4_ = -(uint)(auVar108._12_4_ == iVar124);
      auVar164._4_4_ = auVar114._4_4_;
      auVar164._0_4_ = auVar114._4_4_;
      auVar164._8_4_ = auVar114._12_4_;
      auVar164._12_4_ = auVar114._12_4_;
      auVar108 = pshuflw(auVar114,auVar164,0xe8);
      auVar165._4_4_ = auVar150._4_4_;
      auVar165._0_4_ = auVar150._4_4_;
      auVar165._8_4_ = auVar150._12_4_;
      auVar165._12_4_ = auVar150._12_4_;
      auVar152 = pshuflw(auVar150,auVar165,0xe8);
      auVar62._8_4_ = 0xffffffff;
      auVar62._0_8_ = 0xffffffffffffffff;
      auVar62._12_4_ = 0xffffffff;
      auVar108 = packssdw(auVar108 & auVar154,(auVar152 | auVar108 & auVar154) ^ auVar62);
      auVar108 = packsswb(auVar108,auVar108);
      if ((auVar108 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        acStack_134[uVar93 + 8] = cVar88 + '\f';
      }
      auVar76._4_4_ = auVar150._0_4_;
      auVar76._0_4_ = auVar150._0_4_;
      auVar76._8_4_ = auVar150._8_4_;
      auVar76._12_4_ = auVar150._8_4_;
      auVar165 = auVar164 & auVar76 | auVar165;
      auVar152 = packssdw(auVar165,auVar165);
      auVar63._8_4_ = 0xffffffff;
      auVar63._0_8_ = 0xffffffffffffffff;
      auVar63._12_4_ = 0xffffffff;
      auVar108 = packssdw(auVar108,auVar152 ^ auVar63);
      auVar108 = packsswb(auVar108,auVar108);
      if ((auVar108._12_2_ >> 8 & 1) != 0) {
        acStack_134[uVar93 + 9] = cVar88 + '\r';
      }
      auVar108 = auVar128 ^ _DAT_00111c70;
      auVar151._0_4_ = -(uint)(iVar118 < auVar108._0_4_);
      auVar151._4_4_ = -(uint)(iVar120 < auVar108._4_4_);
      auVar151._8_4_ = -(uint)(iVar85 < auVar108._8_4_);
      auVar151._12_4_ = -(uint)(iVar124 < auVar108._12_4_);
      auVar166._4_4_ = auVar151._0_4_;
      auVar166._0_4_ = auVar151._0_4_;
      auVar166._8_4_ = auVar151._8_4_;
      auVar166._12_4_ = auVar151._8_4_;
      iVar118 = -(uint)(auVar108._4_4_ == iVar120);
      iVar120 = -(uint)(auVar108._12_4_ == iVar124);
      auVar153._4_4_ = iVar118;
      auVar153._0_4_ = iVar118;
      auVar153._8_4_ = iVar120;
      auVar153._12_4_ = iVar120;
      auVar115._4_4_ = auVar151._4_4_;
      auVar115._0_4_ = auVar151._4_4_;
      auVar115._8_4_ = auVar151._12_4_;
      auVar115._12_4_ = auVar151._12_4_;
      auVar115 = auVar153 & auVar166 | auVar115;
      auVar108 = packssdw(auVar115,auVar115);
      auVar64._8_4_ = 0xffffffff;
      auVar64._0_8_ = 0xffffffffffffffff;
      auVar64._12_4_ = 0xffffffff;
      auVar108 = packssdw(auVar108 ^ auVar64,auVar108 ^ auVar64);
      auVar108 = packsswb(auVar108,auVar108);
      if ((auVar108 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        acStack_134[uVar93 + 10] = cVar88 + '\x0e';
      }
      auVar108 = pshufhw(auVar108,auVar166,0x84);
      in_XMM11 = pshufhw(auVar151,auVar153,0x84);
      in_XMM11 = in_XMM11 & auVar108;
      auVar77._4_4_ = auVar151._4_4_;
      auVar77._0_4_ = auVar151._4_4_;
      auVar77._8_4_ = auVar151._12_4_;
      auVar77._12_4_ = auVar151._12_4_;
      auVar108 = pshufhw(auVar108,auVar77,0x84);
      auVar116._8_4_ = 0xffffffff;
      auVar116._0_8_ = 0xffffffffffffffff;
      auVar116._12_4_ = 0xffffffff;
      auVar116 = (auVar108 | in_XMM11) ^ auVar116;
      auVar108 = packssdw(auVar116,auVar116);
      auVar108 = packsswb(auVar108,auVar108);
      if ((auVar108._14_2_ >> 8 & 1) != 0) {
        acStack_134[uVar93 + 0xb] = cVar88 + '\x0f';
      }
      uVar93 = uVar93 + 0x10;
      lVar95 = (long)DAT_00111c80;
      lVar125 = auVar142._8_8_;
      auVar142._0_8_ = auVar142._0_8_ + lVar95;
      lVar119 = DAT_00111c80._8_8_;
      auVar142._8_8_ = lVar125 + lVar119;
      lVar125 = auVar141._8_8_;
      auVar141._0_8_ = auVar141._0_8_ + lVar95;
      auVar141._8_8_ = lVar125 + lVar119;
      lVar125 = auVar140._8_8_;
      auVar140._0_8_ = auVar140._0_8_ + lVar95;
      auVar140._8_8_ = lVar125 + lVar119;
      lVar125 = auVar139._8_8_;
      auVar139._0_8_ = auVar139._0_8_ + lVar95;
      auVar139._8_8_ = lVar125 + lVar119;
      lVar125 = in_XMM4._8_8_;
      in_XMM4._0_8_ = in_XMM4._0_8_ + lVar95;
      in_XMM4._8_8_ = lVar125 + lVar119;
      lVar125 = auVar131._8_8_;
      auVar131._0_8_ = auVar131._0_8_ + lVar95;
      auVar131._8_8_ = lVar125 + lVar119;
      lVar125 = auVar126._8_8_;
      auVar126._0_8_ = auVar126._0_8_ + lVar95;
      auVar126._8_8_ = lVar125 + lVar119;
      lVar125 = auVar128._8_8_;
      auVar128._0_8_ = auVar128._0_8_ + lVar95;
      auVar128._8_8_ = lVar125 + lVar119;
      auVar108 = _DAT_00111c80;
    } while ((iVar83 + 0xfU & 0xfffffff0) != uVar93);
  }
  uVar93 = (ulong)(uint)s->nblock;
  if (s->nblock < 1) {
    uVar84 = 0;
    iVar118 = 0;
  }
  else {
    lVar95 = 0;
    iVar118 = 0;
    uVar84 = 0;
    do {
      UVar3 = local_138._1_1_;
      UVar90 = s->unseqToSeq
               [pUVar102[(int)(((int)(pUVar87[lVar95] - 1) >> 0x1f & (uint)uVar93) + pUVar87[lVar95]
                              + -1)]];
      if ((UChar)local_138 == UVar90) {
        iVar118 = iVar118 + 1;
      }
      else {
        if (0 < iVar118) {
          uVar91 = iVar118 - 1;
          uVar93 = (ulong)(int)uVar84;
          pUVar96 = local_1c0 + uVar93;
          while( true ) {
            uVar84 = (int)uVar93 + 1;
            uVar93 = (ulong)uVar84;
            if ((uVar91 & 1) == 0) {
              *pUVar96 = 0;
              s->mtfFreq[0] = s->mtfFreq[0] + 1;
            }
            else {
              *pUVar96 = 1;
              s->mtfFreq[1] = s->mtfFreq[1] + 1;
            }
            if ((int)uVar91 < 2) break;
            uVar91 = uVar91 - 2 >> 1;
            pUVar96 = pUVar96 + 1;
          }
          iVar118 = 0;
        }
        local_138._1_1_ = (UChar)local_138;
        puVar80 = &local_138;
        while (UVar90 != UVar3) {
          UVar4 = *(UChar *)((long)puVar80 + 2);
          *(UChar *)((long)puVar80 + 2) = UVar3;
          UVar3 = UVar4;
          puVar80 = (undefined4 *)((long)puVar80 + 1);
        }
        local_138._0_1_ = UVar3;
        iVar120 = ((int)(undefined4 *)((long)puVar80 + 1) - (int)&local_138) + 1;
        local_1c0[(int)uVar84] = (UInt16)iVar120;
        uVar84 = uVar84 + 1;
        s->mtfFreq[iVar120] = s->mtfFreq[iVar120] + 1;
      }
      lVar95 = lVar95 + 1;
      uVar93 = (ulong)s->nblock;
    } while (lVar95 < (long)uVar93);
  }
  if (0 < iVar118) {
    uVar91 = iVar118 - 1;
    uVar93 = (ulong)(int)uVar84;
    pUVar96 = local_1c0 + uVar93;
    while( true ) {
      uVar84 = (int)uVar93 + 1;
      uVar93 = (ulong)uVar84;
      if ((uVar91 & 1) == 0) {
        *pUVar96 = 0;
        s->mtfFreq[0] = s->mtfFreq[0] + 1;
      }
      else {
        *pUVar96 = 1;
        s->mtfFreq[1] = s->mtfFreq[1] + 1;
      }
      if ((int)uVar91 < 2) break;
      uVar91 = uVar91 - 2 >> 1;
      pUVar96 = pUVar96 + 1;
    }
  }
  local_1c0[(int)uVar84] = (short)iVar83 + 1;
  s->mtfFreq[lVar86 + 1] = s->mtfFreq[lVar86 + 1] + 1;
  s->nMTF = uVar84 + 1;
  if (2 < s->verbosity) {
    fprintf(_stderr,"      %d in block, %d after MTF & 1-2 coding, %d+2 syms in use\n",
            (ulong)(uint)s->nblock,(ulong)(uVar84 + 1),(ulong)(uint)s->nInUse);
  }
  iVar83 = s->nInUse;
  uVar84 = iVar83 + 2;
  uVar93 = 1;
  if (1 < (int)uVar84) {
    uVar93 = (ulong)uVar84;
  }
  paUVar1 = s->len;
  lVar86 = 0;
  local_1b8 = uVar93;
  do {
    if (-2 < iVar83) {
      memset(*paUVar1 + lVar86,0xf,uVar93);
      uVar93 = local_1b8;
    }
    lVar86 = lVar86 + 0x102;
  } while (lVar86 != 0x60c);
  if (s->nMTF < 1) {
    BZ2_bz__AssertH__fail(0xbb9);
    uVar93 = local_1b8;
  }
  iVar118 = s->nMTF;
  uVar97 = 0;
  if (iVar118 < 200) {
    uVar91 = 2;
LAB_00107e76:
    local_1b0 = 0;
  }
  else {
    if (iVar118 < 600) {
      uVar91 = 3;
      goto LAB_00107e76;
    }
    if (iVar118 < 0x4b0) {
      uVar91 = 4;
      goto LAB_00107e76;
    }
    local_1b0 = (ulong)(0x95f < iVar118);
    uVar91 = (0x95f < iVar118) + 5;
  }
  uVar107 = (ulong)uVar91;
  pUVar102 = s->selectorMtf + (ulong)(uVar91 * 0x102) + 0x4550;
  uVar101 = uVar107;
  local_168 = s->inUse;
  do {
    iVar85 = iVar118 / (int)uVar101;
    iVar120 = (int)uVar97;
    uVar104 = iVar120 - 1;
    uVar106 = (ulong)uVar104;
    uVar99 = 0;
    if ((0 < iVar85) && ((int)uVar104 <= iVar83)) {
      uVar99 = 0;
      uVar105 = (long)(int)uVar104;
      do {
        uVar104 = (int)uVar99 + s->mtfFreq[uVar105 + 1];
        uVar99 = (ulong)uVar104;
        uVar106 = uVar105 + 1;
        if ((long)iVar83 <= (long)uVar105) break;
        uVar105 = uVar106;
      } while ((int)uVar104 < iVar85);
    }
    iVar85 = (int)uVar106;
    if (((iVar120 < iVar85) && (uVar101 != 1 && uVar101 != uVar107)) &&
       ((uVar91 - (int)uVar101 & 0x80000001) == 1)) {
      uVar99 = (ulong)(uint)((int)uVar99 - s->mtfFreq[iVar85]);
      uVar106 = (ulong)(iVar85 - 1);
    }
    if (2 < s->verbosity) {
      local_1a8._0_4_ = iVar118;
      fprintf(_stderr,"      initial group %d, [%d .. %d], has %d syms (%4.1f%%)\n",
              ((double)(int)uVar99 * 100.0) / (double)s->nMTF,uVar101 & 0xffffffff,uVar97,
              uVar106 & 0xffffffff,uVar99);
      uVar93 = local_1b8;
      iVar118 = local_1a8._0_4_;
    }
    if (-2 < iVar83) {
      uVar97 = 0;
      do {
        UVar90 = '\0';
        if ((long)(int)uVar106 < (long)uVar97) {
          UVar90 = '\x0f';
        }
        if ((long)uVar97 < (long)iVar120) {
          UVar90 = '\x0f';
        }
        pUVar102[uVar97] = UVar90;
        uVar97 = uVar97 + 1;
      } while (uVar93 != uVar97);
    }
    iVar118 = iVar118 - (int)uVar99;
    pUVar102 = pUVar102 + -0x102;
    uVar97 = (ulong)((int)uVar106 + 1);
    bVar55 = 1 < (long)uVar101;
    uVar101 = uVar101 - 1;
  } while (bVar55);
  local_188 = s->rfreq;
  local_150 = (size_t)(uVar91 * 4);
  local_158 = uVar93 * 4;
  local_140 = (ulong)(uVar91 * 2);
  bVar82 = -2 < iVar83 & (byte)local_1b0;
  local_178 = (ulong)(uVar91 * 0x408);
  local_160 = s->len_pack[0] + 2;
  local_148 = s->len;
  local_180 = 0;
  do {
    __n = local_158;
    paIVar100 = local_188;
    memset(&local_138,0,local_150);
    uVar93 = 0;
    do {
      if (-2 < iVar83) {
        memset((void *)((long)*paIVar100 + uVar93),0,__n);
      }
      pUVar96 = local_1c0;
      uVar93 = uVar93 + 0x408;
    } while (local_178 != uVar93);
    if (bVar82 != 0) {
      uVar93 = 0;
      pUVar87 = local_160;
      do {
        (*(UInt32 (*) [4])(pUVar87 + -2))[0] =
             (uint)s->len[0][uVar93] | (uint)s->len[1][uVar93] << 0x10;
        pUVar87[-1] = (uint)s->len[2][uVar93] | (uint)s->len[3][uVar93] << 0x10;
        *pUVar87 = (uint)s->len[4][uVar93] | (uint)s->len[5][uVar93] << 0x10;
        uVar93 = uVar93 + 1;
        pUVar87 = pUVar87 + 4;
      } while (local_1b8 != uVar93);
    }
    iVar118 = s->nMTF;
    if (iVar118 < 1) {
      auVar79._8_8_ = 0;
      auVar79._0_8_ = local_1a8._8_8_;
      local_1a8 = auVar79 << 0x40;
    }
    else {
      auVar78._8_8_ = 0;
      auVar78._0_8_ = local_1a8._8_8_;
      local_1a8 = auVar78 << 0x40;
      iVar120 = 0;
      do {
        memset(&local_194,0,local_140);
        paUVar103 = local_148;
        paIVar100 = local_188;
        iVar85 = iVar118 + -1;
        if (iVar120 + 0x31 < iVar118) {
          iVar85 = iVar120 + 0x31;
        }
        bVar89 = iVar85 - iVar120 == 0x31 & (byte)local_1b0;
        if (bVar89 == 0) {
          if (iVar120 <= iVar85) {
            lVar86 = (long)iVar120;
            do {
              pUVar102 = *paUVar103 + pUVar96[lVar86];
              uVar93 = 0;
              do {
                psVar2 = (short *)((long)&local_194 + uVar93 * 2);
                *psVar2 = *psVar2 + (ushort)*pUVar102;
                uVar93 = uVar93 + 1;
                pUVar102 = pUVar102 + 0x102;
              } while (uVar107 != uVar93);
              lVar86 = lVar86 + 1;
            } while (iVar85 + 1 != (int)lVar86);
          }
        }
        else {
          uVar5 = pUVar96[iVar120];
          uVar6 = pUVar96[(long)iVar120 + 1];
          uVar7 = pUVar96[(long)iVar120 + 2];
          uVar8 = pUVar96[(long)iVar120 + 3];
          uVar9 = pUVar96[(long)iVar120 + 4];
          uVar10 = pUVar96[(long)iVar120 + 5];
          uVar11 = pUVar96[(long)iVar120 + 6];
          uVar12 = pUVar96[(long)iVar120 + 7];
          uVar13 = pUVar96[(long)iVar120 + 8];
          uVar14 = pUVar96[(long)iVar120 + 9];
          uVar15 = pUVar96[(long)iVar120 + 10];
          uVar16 = pUVar96[(long)iVar120 + 0xb];
          uVar17 = pUVar96[(long)iVar120 + 0xc];
          uVar18 = pUVar96[(long)iVar120 + 0xd];
          uVar19 = pUVar96[(long)iVar120 + 0xe];
          uVar20 = pUVar96[(long)iVar120 + 0xf];
          uVar21 = pUVar96[(long)iVar120 + 0x10];
          uVar22 = pUVar96[(long)iVar120 + 0x11];
          uVar23 = pUVar96[(long)iVar120 + 0x12];
          uVar24 = pUVar96[(long)iVar120 + 0x13];
          uVar25 = pUVar96[(long)iVar120 + 0x14];
          uVar26 = pUVar96[(long)iVar120 + 0x15];
          uVar27 = pUVar96[(long)iVar120 + 0x16];
          uVar28 = pUVar96[(long)iVar120 + 0x17];
          uVar29 = pUVar96[(long)iVar120 + 0x18];
          uVar30 = pUVar96[(long)iVar120 + 0x19];
          uVar31 = pUVar96[(long)iVar120 + 0x1a];
          uVar32 = pUVar96[(long)iVar120 + 0x1b];
          uVar33 = pUVar96[(long)iVar120 + 0x1c];
          uVar34 = pUVar96[(long)iVar120 + 0x1d];
          uVar35 = pUVar96[(long)iVar120 + 0x1e];
          uVar36 = pUVar96[(long)iVar120 + 0x1f];
          uVar37 = pUVar96[(long)iVar120 + 0x20];
          uVar38 = pUVar96[(long)iVar120 + 0x21];
          uVar39 = pUVar96[(long)iVar120 + 0x22];
          uVar40 = pUVar96[(long)iVar120 + 0x23];
          uVar41 = pUVar96[(long)iVar120 + 0x24];
          uVar42 = pUVar96[(long)iVar120 + 0x25];
          uVar43 = pUVar96[(long)iVar120 + 0x26];
          uVar44 = pUVar96[(long)iVar120 + 0x27];
          uVar45 = pUVar96[(long)iVar120 + 0x28];
          uVar46 = pUVar96[(long)iVar120 + 0x29];
          uVar47 = pUVar96[(long)iVar120 + 0x2a];
          uVar48 = pUVar96[(long)iVar120 + 0x2b];
          uVar49 = pUVar96[(long)iVar120 + 0x2c];
          uVar50 = pUVar96[(long)iVar120 + 0x2d];
          uVar51 = pUVar96[(long)iVar120 + 0x2e];
          uVar52 = pUVar96[(long)iVar120 + 0x2f];
          uVar53 = pUVar96[(long)iVar120 + 0x30];
          uVar54 = pUVar96[(long)iVar120 + 0x31];
          local_194 = s->len_pack[uVar6][0] + s->len_pack[uVar5][0] + s->len_pack[uVar7][0] +
                      s->len_pack[uVar8][0] + s->len_pack[uVar9][0] + s->len_pack[uVar10][0] +
                      s->len_pack[uVar11][0] + s->len_pack[uVar12][0] + s->len_pack[uVar13][0] +
                      s->len_pack[uVar14][0] + s->len_pack[uVar15][0] + s->len_pack[uVar16][0] +
                      s->len_pack[uVar17][0] + s->len_pack[uVar18][0] + s->len_pack[uVar19][0] +
                      s->len_pack[uVar20][0] + s->len_pack[uVar21][0] + s->len_pack[uVar22][0] +
                      s->len_pack[uVar23][0] + s->len_pack[uVar24][0] + s->len_pack[uVar25][0] +
                      s->len_pack[uVar26][0] + s->len_pack[uVar27][0] + s->len_pack[uVar28][0] +
                      s->len_pack[uVar29][0] + s->len_pack[uVar30][0] + s->len_pack[uVar31][0] +
                      s->len_pack[uVar32][0] + s->len_pack[uVar33][0] + s->len_pack[uVar34][0] +
                      s->len_pack[uVar35][0] + s->len_pack[uVar36][0] + s->len_pack[uVar37][0] +
                      s->len_pack[uVar38][0] + s->len_pack[uVar39][0] + s->len_pack[uVar40][0] +
                      s->len_pack[uVar41][0] + s->len_pack[uVar42][0] + s->len_pack[uVar43][0] +
                      s->len_pack[uVar44][0] + s->len_pack[uVar45][0] + s->len_pack[uVar46][0] +
                      s->len_pack[uVar47][0] + s->len_pack[uVar48][0] + s->len_pack[uVar49][0] +
                      s->len_pack[uVar50][0] + s->len_pack[uVar51][0] + s->len_pack[uVar52][0] +
                      s->len_pack[uVar53][0] + s->len_pack[uVar54][0];
          local_190 = s->len_pack[uVar6][1] + s->len_pack[uVar5][1] + s->len_pack[uVar7][1] +
                      s->len_pack[uVar8][1] + s->len_pack[uVar9][1] + s->len_pack[uVar10][1] +
                      s->len_pack[uVar11][1] + s->len_pack[uVar12][1] + s->len_pack[uVar13][1] +
                      s->len_pack[uVar14][1] + s->len_pack[uVar15][1] + s->len_pack[uVar16][1] +
                      s->len_pack[uVar17][1] + s->len_pack[uVar18][1] + s->len_pack[uVar19][1] +
                      s->len_pack[uVar20][1] + s->len_pack[uVar21][1] + s->len_pack[uVar22][1] +
                      s->len_pack[uVar23][1] + s->len_pack[uVar24][1] + s->len_pack[uVar25][1] +
                      s->len_pack[uVar26][1] + s->len_pack[uVar27][1] + s->len_pack[uVar28][1] +
                      s->len_pack[uVar29][1] + s->len_pack[uVar30][1] + s->len_pack[uVar31][1] +
                      s->len_pack[uVar32][1] + s->len_pack[uVar33][1] + s->len_pack[uVar34][1] +
                      s->len_pack[uVar35][1] + s->len_pack[uVar36][1] + s->len_pack[uVar37][1] +
                      s->len_pack[uVar38][1] + s->len_pack[uVar39][1] + s->len_pack[uVar40][1] +
                      s->len_pack[uVar41][1] + s->len_pack[uVar42][1] + s->len_pack[uVar43][1] +
                      s->len_pack[uVar44][1] + s->len_pack[uVar45][1] + s->len_pack[uVar46][1] +
                      s->len_pack[uVar47][1] + s->len_pack[uVar48][1] + s->len_pack[uVar49][1] +
                      s->len_pack[uVar50][1] + s->len_pack[uVar51][1] + s->len_pack[uVar52][1] +
                      s->len_pack[uVar53][1] + s->len_pack[uVar54][1];
          local_18c = s->len_pack[uVar6][2] + s->len_pack[uVar5][2] + s->len_pack[uVar7][2] +
                      s->len_pack[uVar8][2] + s->len_pack[uVar9][2] + s->len_pack[uVar10][2] +
                      s->len_pack[uVar11][2] + s->len_pack[uVar12][2] + s->len_pack[uVar13][2] +
                      s->len_pack[uVar14][2] + s->len_pack[uVar15][2] + s->len_pack[uVar16][2] +
                      s->len_pack[uVar17][2] + s->len_pack[uVar18][2] + s->len_pack[uVar19][2] +
                      s->len_pack[uVar20][2] + s->len_pack[uVar21][2] + s->len_pack[uVar22][2] +
                      s->len_pack[uVar23][2] + s->len_pack[uVar24][2] + s->len_pack[uVar25][2] +
                      s->len_pack[uVar26][2] + s->len_pack[uVar27][2] + s->len_pack[uVar28][2] +
                      s->len_pack[uVar29][2] + s->len_pack[uVar30][2] + s->len_pack[uVar31][2] +
                      s->len_pack[uVar32][2] + s->len_pack[uVar33][2] + s->len_pack[uVar34][2] +
                      s->len_pack[uVar35][2] + s->len_pack[uVar36][2] + s->len_pack[uVar37][2] +
                      s->len_pack[uVar38][2] + s->len_pack[uVar39][2] + s->len_pack[uVar40][2] +
                      s->len_pack[uVar41][2] + s->len_pack[uVar42][2] + s->len_pack[uVar43][2] +
                      s->len_pack[uVar44][2] + s->len_pack[uVar45][2] + s->len_pack[uVar46][2] +
                      s->len_pack[uVar47][2] + s->len_pack[uVar48][2] + s->len_pack[uVar49][2] +
                      s->len_pack[uVar50][2] + s->len_pack[uVar51][2] + s->len_pack[uVar52][2] +
                      s->len_pack[uVar53][2] + s->len_pack[uVar54][2];
        }
        uVar93 = 0xffffffff;
        uVar97 = 0;
        uVar104 = 999999999;
        do {
          uVar5 = *(ushort *)((long)&local_194 + uVar97 * 2);
          uVar94 = (uint)uVar5;
          if (uVar104 < uVar5) {
            uVar94 = uVar104;
          }
          if (uVar5 < uVar104) {
            uVar93 = uVar97 & 0xffffffff;
          }
          uVar97 = uVar97 + 1;
          uVar104 = uVar94;
        } while (uVar107 != uVar97);
        iVar118 = (int)uVar93;
        (&local_138)[iVar118] = (&local_138)[iVar118] + 1;
        s->selector[local_1a8._0_8_] = (UChar)uVar93;
        if (bVar89 == 0) {
          if (iVar120 <= iVar85) {
            lVar86 = 0;
            do {
              paIVar100[iVar118][pUVar96[iVar120 + lVar86]] =
                   paIVar100[iVar118][pUVar96[iVar120 + lVar86]] + 1;
              lVar86 = lVar86 + 1;
            } while ((iVar85 - iVar120) + 1 != (int)lVar86);
          }
        }
        else {
          paIVar100[iVar118][pUVar96[iVar120]] = paIVar100[iVar118][pUVar96[iVar120]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 1]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 1]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 2]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 2]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 3]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 3]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 4]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 4]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 5]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 5]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 6]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 6]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 7]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 7]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 8]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 8]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 9]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 9]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 10]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 10]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0xb]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0xb]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0xc]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0xc]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0xd]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0xd]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0xe]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0xe]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0xf]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0xf]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x10]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x10]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x11]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x11]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x12]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x12]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x13]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x13]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x14]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x14]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x15]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x15]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x16]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x16]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x17]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x17]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x18]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x18]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x19]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x19]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x1a]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x1a]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x1b]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x1b]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x1c]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x1c]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x1d]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x1d]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x1e]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x1e]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x1f]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x1f]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x20]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x20]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x21]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x21]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x22]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x22]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x23]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x23]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x24]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x24]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x25]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x25]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x26]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x26]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x27]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x27]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x28]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x28]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x29]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x29]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x2a]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x2a]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x2b]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x2b]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x2c]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x2c]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x2d]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x2d]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x2e]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x2e]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x2f]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x2f]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x30]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x30]] + 1;
          paIVar100[iVar118][pUVar96[(long)iVar120 + 0x31]] =
               paIVar100[iVar118][pUVar96[(long)iVar120 + 0x31]] + 1;
        }
        local_1a8._0_8_ = local_1a8._0_8_ + 1;
        iVar120 = iVar85 + 1;
        iVar118 = s->nMTF;
      } while (iVar120 < iVar118);
    }
    paIVar100 = local_188;
    paUVar103 = paUVar1;
    uVar93 = uVar107;
    if (2 < s->verbosity) {
      BZ2_compressBlock_cold_1();
      paIVar100 = local_188;
    }
    do {
      BZ2_hbMakeCodeLengths(*paUVar103,*paIVar100,uVar84,0x11);
      uVar93 = uVar93 - 1;
      paIVar100 = paIVar100 + 1;
      paUVar103 = paUVar103 + 1;
    } while (uVar93 != 0);
    uVar104 = (int)local_180 + 1;
    local_180 = (ulong)uVar104;
  } while (uVar104 != 4);
  uVar81 = local_1a8._0_8_;
  iVar118 = local_1a8._0_4_;
  if (0x4652 < iVar118) {
    BZ2_bz__AssertH__fail(0xbbb);
  }
  lVar86 = uVar107 - 1;
  auVar121._8_4_ = (int)lVar86;
  auVar121._0_8_ = lVar86;
  auVar121._12_4_ = (int)((ulong)lVar86 >> 0x20);
  auVar121 = auVar121 ^ _DAT_00111c70;
  iVar120 = auVar121._0_4_;
  iVar85 = auVar121._4_4_;
  iVar124 = auVar121._8_4_;
  iVar167 = auVar121._12_4_;
  auVar132._0_4_ = -(uint)(iVar120 < -0x80000000);
  auVar132._4_4_ = -(uint)(iVar120 < -0x80000000);
  auVar132._8_4_ = -(uint)(iVar124 < -0x7fffffff);
  auVar132._12_4_ = -(uint)(iVar124 < -0x7fffffff);
  auVar127._0_4_ = -(uint)(iVar85 == -0x80000000);
  auVar127._4_4_ = -(uint)(iVar85 == -0x80000000);
  auVar127._8_4_ = -(uint)(iVar167 == -0x80000000);
  auVar127._12_4_ = -(uint)(iVar167 == -0x80000000);
  auVar127 = auVar127 & auVar132;
  auVar108 = pshuflw(in_XMM4,auVar127,0xe8);
  auVar133._8_4_ = 0xffffffff;
  auVar133._0_8_ = 0xffffffffffffffff;
  auVar133._12_4_ = 0xffffffff;
  auVar108 = packssdw(auVar108 ^ auVar133,auVar108 ^ auVar133);
  if ((auVar108 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_1d8[0] = '\0';
  }
  auVar128 = packssdw(auVar127,auVar127);
  auVar128 = packssdw(auVar128 ^ auVar133,auVar128 ^ auVar133);
  if ((auVar128._0_4_ >> 0x10 & 1) != 0) {
    local_1d8[1] = 1;
  }
  auVar134._0_4_ = -(uint)(iVar120 < -0x7ffffffe);
  auVar134._4_4_ = -(uint)(iVar120 < -0x7ffffffe);
  auVar134._8_4_ = -(uint)(iVar124 < -0x7ffffffd);
  auVar134._12_4_ = -(uint)(iVar124 < -0x7ffffffd);
  auVar129._0_4_ = -(uint)(iVar85 == -0x80000000);
  auVar129._4_4_ = -(uint)(iVar85 == -0x80000000);
  auVar129._8_4_ = -(uint)(iVar167 == -0x80000000);
  auVar129._12_4_ = -(uint)(iVar167 == -0x80000000);
  auVar129 = auVar129 & auVar134;
  auVar108 = packssdw(auVar108,auVar129);
  auVar135._8_4_ = 0xffffffff;
  auVar135._0_8_ = 0xffffffffffffffff;
  auVar135._12_4_ = 0xffffffff;
  auVar108 = packssdw(auVar108 ^ auVar135,auVar108 ^ auVar135);
  if ((auVar108 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    local_1d8[2] = 2;
  }
  auVar128 = pshufhw(auVar129,auVar129,0x84);
  auVar128 = packssdw(auVar128 ^ auVar135,auVar128 ^ auVar135);
  if ((auVar128 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
    local_1d8[3] = 3;
  }
  auVar136._0_4_ = -(uint)(iVar120 < -0x7ffffffc);
  auVar136._4_4_ = -(uint)(iVar120 < -0x7ffffffc);
  auVar136._8_4_ = -(uint)(iVar124 < -0x7ffffffb);
  auVar136._12_4_ = -(uint)(iVar124 < -0x7ffffffb);
  auVar130._0_4_ = -(uint)(iVar85 == -0x80000000);
  auVar130._4_4_ = -(uint)(iVar85 == -0x80000000);
  auVar130._8_4_ = -(uint)(iVar167 == -0x80000000);
  auVar130._12_4_ = -(uint)(iVar167 == -0x80000000);
  auVar130 = auVar130 & auVar136;
  auVar108 = pshuflw(auVar108,auVar130,0xe8);
  auVar137._8_4_ = 0xffffffff;
  auVar137._0_8_ = 0xffffffffffffffff;
  auVar137._12_4_ = 0xffffffff;
  auVar108 = packssdw(auVar108 ^ auVar137,auVar108 ^ auVar137);
  if ((auVar108 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_1d8[4] = 4;
  }
  auVar108 = packssdw(auVar130,auVar130);
  auVar108 = packssdw(auVar108 ^ auVar137,auVar108 ^ auVar137);
  if ((auVar108 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
    local_1d8[5] = 5;
  }
  auVar138._0_4_ = -(uint)(iVar120 < (int)DAT_00111cc0);
  auVar138._4_4_ = -(uint)(iVar120 < (int)DAT_00111cc0);
  auVar138._8_4_ = -(uint)(iVar124 < DAT_00111cc0._8_4_);
  auVar138._12_4_ = -(uint)(iVar124 < DAT_00111cc0._8_4_);
  auVar117._0_4_ = -(uint)(DAT_00111cc0._4_4_ == iVar85);
  auVar117._4_4_ = -(uint)(DAT_00111cc0._4_4_ == iVar85);
  auVar117._8_4_ = -(uint)(DAT_00111cc0._12_4_ == iVar167);
  auVar117._12_4_ = -(uint)(DAT_00111cc0._12_4_ == iVar167);
  auVar117 = auVar117 & auVar138;
  auVar108 = packssdw(_DAT_00111cc0,auVar117);
  auVar122._8_4_ = 0xffffffff;
  auVar122._0_8_ = 0xffffffffffffffff;
  auVar122._12_4_ = 0xffffffff;
  auVar108 = packssdw(auVar108 ^ auVar122,auVar108 ^ auVar122);
  if ((auVar108 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    local_1d8[6] = 6;
  }
  auVar108 = pshufhw(auVar117,auVar117,0x84);
  auVar108 = packssdw(auVar108 ^ auVar122,auVar108 ^ auVar122);
  if ((auVar108 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
    local_1d8[7] = 7;
  }
  if (0 < iVar118) {
    uVar93 = 0;
    UVar90 = local_1d8[0];
    do {
      UVar3 = s->selector[uVar93];
      lVar86 = 0;
      while (UVar3 != UVar90) {
        UVar4 = local_1d8[lVar86 + 1];
        local_1d8[lVar86 + 1] = UVar90;
        lVar86 = lVar86 + 1;
        UVar90 = UVar4;
      }
      s->selectorMtf[uVar93] = (UChar)lVar86;
      uVar93 = uVar93 + 1;
    } while (uVar93 != (uVar81 & 0xffffffff));
  }
  uVar93 = 0;
  paUVar103 = paUVar1;
  local_178 = uVar81 & 0xffffffff;
  do {
    uVar94 = 0x20;
    uVar104 = 0;
    if (-2 < iVar83) {
      uVar97 = 0;
      uVar104 = 0;
      do {
        uVar92 = (uint)(*paUVar103)[uVar97];
        if (uVar104 <= (*paUVar103)[uVar97]) {
          uVar104 = uVar92;
        }
        if (uVar92 <= uVar94) {
          uVar94 = uVar92;
        }
        uVar97 = uVar97 + 1;
      } while (local_1b8 != uVar97);
    }
    if (0x11 < uVar104) {
      BZ2_bz__AssertH__fail(0xbbc);
    }
    if (uVar94 == 0) {
      BZ2_bz__AssertH__fail(0xbbd);
    }
    BZ2_hbAssignCodes(s->code[uVar93],paUVar1[uVar93],uVar94,uVar104,uVar84);
    uVar97 = local_178;
    auVar108 = local_1a8;
    pUVar96 = local_1c0;
    uVar93 = uVar93 + 1;
    paUVar103 = paUVar103 + 1;
  } while (uVar93 != uVar107);
  lVar86 = 0;
  pBVar98 = local_168;
  do {
    local_1d8[lVar86] = '\0';
    auVar123[0] = -(*pBVar98 == '\0');
    auVar123[1] = -(pBVar98[1] == '\0');
    auVar123[2] = -(pBVar98[2] == '\0');
    auVar123[3] = -(pBVar98[3] == '\0');
    auVar123[4] = -(pBVar98[4] == '\0');
    auVar123[5] = -(pBVar98[5] == '\0');
    auVar123[6] = -(pBVar98[6] == '\0');
    auVar123[7] = -(pBVar98[7] == '\0');
    auVar123[8] = -(pBVar98[8] == '\0');
    auVar123[9] = -(pBVar98[9] == '\0');
    auVar123[10] = -(pBVar98[10] == '\0');
    auVar123[0xb] = -(pBVar98[0xb] == '\0');
    auVar123[0xc] = -(pBVar98[0xc] == '\0');
    auVar123[0xd] = -(pBVar98[0xd] == '\0');
    auVar123[0xe] = -(pBVar98[0xe] == '\0');
    auVar123[0xf] = -(pBVar98[0xf] == '\0');
    if ((ushort)((ushort)(SUB161(auVar123 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar123 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar123 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar123 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar123 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar123 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar123 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar123 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar123 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar123 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar123 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar123 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar123 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar123 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar123 >> 0x77,0) & 1) << 0xe |
                (ushort)(auVar123[0xf] >> 7) << 0xf) != 0xffff) {
      local_1d8[lVar86] = '\x01';
    }
    lVar86 = lVar86 + 1;
    pBVar98 = pBVar98 + 0x10;
  } while (lVar86 != 0x10);
  iVar118 = s->numZ;
  lVar86 = 0;
  do {
    iVar120 = s->bsLive;
    if (local_1d8[lVar86] == '\0') {
      if (7 < iVar120) {
        do {
          s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
          s->numZ = s->numZ + 1;
          s->bsBuff = s->bsBuff << 8;
          iVar85 = s->bsLive;
          iVar120 = iVar85 + -8;
          s->bsLive = iVar120;
        } while (0xf < iVar85);
      }
    }
    else {
      if (7 < iVar120) {
        do {
          s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
          s->numZ = s->numZ + 1;
          s->bsBuff = s->bsBuff << 8;
          iVar85 = s->bsLive;
          iVar120 = iVar85 + -8;
          s->bsLive = iVar120;
        } while (0xf < iVar85);
      }
      s->bsBuff = s->bsBuff | 0x80000000U >> ((byte)iVar120 & 0x1f);
    }
    s->bsLive = iVar120 + 1;
    lVar86 = lVar86 + 1;
  } while (lVar86 != 0x10);
  lVar86 = 0;
  do {
    if (local_1d8[lVar86] != '\0') {
      lVar95 = 0;
      do {
        iVar120 = s->bsLive;
        if (s->inUse[lVar95 + lVar86 * 0x10] == '\0') {
          if (7 < iVar120) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar85 = s->bsLive;
              iVar120 = iVar85 + -8;
              s->bsLive = iVar120;
            } while (0xf < iVar85);
          }
        }
        else {
          if (7 < iVar120) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar85 = s->bsLive;
              iVar120 = iVar85 + -8;
              s->bsLive = iVar120;
            } while (0xf < iVar85);
          }
          s->bsBuff = s->bsBuff | 0x80000000U >> ((byte)iVar120 & 0x1f);
        }
        s->bsLive = iVar120 + 1;
        lVar95 = lVar95 + 1;
      } while (lVar95 != 0x10);
    }
    lVar86 = lVar86 + 1;
  } while (lVar86 != 0x10);
  if (2 < s->verbosity) {
    fprintf(_stderr,"      bytes: mapping %d, ",(ulong)(uint)(s->numZ - iVar118));
  }
  iVar120 = s->numZ;
  iVar118 = s->bsLive;
  if (7 < iVar118) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar85 = s->bsLive;
      iVar118 = iVar85 + -8;
      s->bsLive = iVar118;
    } while (0xf < iVar85);
  }
  s->bsBuff = s->bsBuff | uVar91 << (0x1dU - (char)iVar118 & 0x1f);
  iVar118 = iVar118 + 3;
  s->bsLive = iVar118;
  if (7 < iVar118) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar85 = s->bsLive;
      iVar118 = iVar85 + -8;
      s->bsLive = iVar118;
    } while (0xf < iVar85);
  }
  s->bsBuff = s->bsBuff | auVar108._0_4_ << (0x11U - (char)iVar118 & 0x1f);
  s->bsLive = iVar118 + 0xf;
  if (0 < auVar108._0_4_) {
    uVar93 = 0;
    do {
      if (s->selectorMtf[uVar93] != '\0') {
        uVar84 = 0;
        do {
          iVar118 = s->bsLive;
          if (7 < iVar118) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar85 = s->bsLive;
              iVar118 = iVar85 + -8;
              s->bsLive = iVar118;
            } while (0xf < iVar85);
          }
          s->bsBuff = s->bsBuff | 0x80000000U >> ((byte)iVar118 & 0x1f);
          s->bsLive = iVar118 + 1;
          uVar84 = uVar84 + 1;
        } while (uVar84 < s->selectorMtf[uVar93]);
      }
      iVar118 = s->bsLive;
      if (7 < iVar118) {
        do {
          s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
          s->numZ = s->numZ + 1;
          s->bsBuff = s->bsBuff << 8;
          iVar85 = s->bsLive;
          iVar118 = iVar85 + -8;
          s->bsLive = iVar118;
        } while (0xf < iVar85);
      }
      s->bsLive = iVar118 + 1;
      uVar93 = uVar93 + 1;
    } while (uVar93 != uVar97);
  }
  if (2 < s->verbosity) {
    fprintf(_stderr,"selectors %d, ",(ulong)(uint)(s->numZ - iVar120));
  }
  iVar118 = s->numZ;
  uVar93 = 0;
  do {
    bVar82 = paUVar1[uVar93][0];
    uVar84 = (uint)bVar82;
    iVar120 = s->bsLive;
    if (7 < iVar120) {
      do {
        s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
        s->numZ = s->numZ + 1;
        s->bsBuff = s->bsBuff << 8;
        iVar85 = s->bsLive;
        iVar120 = iVar85 + -8;
        s->bsLive = iVar120;
      } while (0xf < iVar85);
    }
    s->bsBuff = s->bsBuff | (uint)bVar82 << (0x1bU - (char)iVar120 & 0x1f);
    s->bsLive = iVar120 + 5;
    if (-2 < iVar83) {
      uVar97 = 0;
      do {
        bVar82 = paUVar1[uVar93][uVar97];
        for (; (int)uVar84 < (int)(uint)bVar82; uVar84 = uVar84 + 1) {
          iVar120 = s->bsLive;
          if (7 < iVar120) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar85 = s->bsLive;
              iVar120 = iVar85 + -8;
              s->bsLive = iVar120;
            } while (0xf < iVar85);
          }
          s->bsBuff = s->bsBuff | 2 << (0x1eU - (char)iVar120 & 0x1f);
          s->bsLive = iVar120 + 2;
          bVar82 = paUVar1[uVar93][uVar97];
        }
        for (; (int)(uint)paUVar1[uVar93][uVar97] < (int)uVar84; uVar84 = uVar84 - 1) {
          iVar120 = s->bsLive;
          if (7 < iVar120) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar85 = s->bsLive;
              iVar120 = iVar85 + -8;
              s->bsLive = iVar120;
            } while (0xf < iVar85);
          }
          s->bsBuff = s->bsBuff | 3 << (0x1eU - (char)iVar120 & 0x1f);
          s->bsLive = iVar120 + 2;
        }
        iVar120 = s->bsLive;
        if (7 < iVar120) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar85 = s->bsLive;
            iVar120 = iVar85 + -8;
            s->bsLive = iVar120;
          } while (0xf < iVar85);
        }
        s->bsLive = iVar120 + 1;
        uVar97 = uVar97 + 1;
      } while (uVar97 != local_1b8);
    }
    uVar93 = uVar93 + 1;
  } while (uVar93 != uVar107);
  if (2 < s->verbosity) {
    fprintf(_stderr,"code lengths %d, ",(ulong)(uint)(s->numZ - iVar118));
  }
  iVar83 = s->numZ;
  iVar118 = s->nMTF;
  lVar86 = 0;
  if (0 < iVar118) {
    iVar120 = 0;
    do {
      iVar85 = iVar118 + -1;
      if (iVar120 + 0x31 < iVar118) {
        iVar85 = iVar120 + 0x31;
      }
      if (uVar91 <= s->selector[lVar86]) {
        BZ2_bz__AssertH__fail(0xbbe);
      }
      if (((byte)local_1b0 & iVar85 - iVar120 == 0x31) == 0) {
        if (iVar120 <= iVar85) {
          lVar95 = (long)iVar120;
          do {
            bVar82 = s->selector[lVar86];
            bVar89 = (*paUVar1)[(ulong)pUVar96[lVar95] + (ulong)bVar82 * 0x100 + (ulong)bVar82 * 2];
            iVar120 = s->code[0][(ulong)bVar82 * 2 + (ulong)bVar82 * 0x100 + (ulong)pUVar96[lVar95]]
            ;
            iVar118 = s->bsLive;
            if (7 < iVar118) {
              do {
                s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
                s->numZ = s->numZ + 1;
                s->bsBuff = s->bsBuff << 8;
                iVar124 = s->bsLive;
                iVar118 = iVar124 + -8;
                s->bsLive = iVar118;
              } while (0xf < iVar124);
            }
            iVar118 = iVar118 + (uint)bVar89;
            s->bsBuff = s->bsBuff | iVar120 << (-(char)iVar118 & 0x1fU);
            s->bsLive = iVar118;
            lVar95 = lVar95 + 1;
          } while (iVar85 + 1 != (int)lVar95);
        }
      }
      else {
        bVar82 = s->selector[lVar86];
        uVar97 = (ulong)bVar82;
        lVar95 = (ulong)bVar82 * 0x100 + uVar97 * 2;
        uVar93 = (ulong)bVar82;
        bVar82 = (*paUVar1)[(ulong)pUVar96[iVar120] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[iVar120]];
        iVar118 = s->bsLive;
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 1] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 1]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 2] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 2]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 3] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 3]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 4] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 4]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 5] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 5]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 6] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 6]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 7] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 7]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 8] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 8]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 9] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 9]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 10] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 10]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0xb] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0xb]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0xc] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0xc]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0xd] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0xd]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0xe] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0xe]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0xf] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0xf]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x10] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x10]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x11] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x11]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x12] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x12]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x13] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x13]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x14] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x14]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x15] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x15]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x16] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x16]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x17] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x17]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x18] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x18]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x19] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x19]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x1a] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x1a]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x1b] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x1b]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x1c] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x1c]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x1d] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x1d]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x1e] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x1e]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x1f] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x1f]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x20] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x20]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x21] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x21]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x22] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x22]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x23] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x23]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x24] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x24]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x25] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x25]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x26] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x26]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x27] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x27]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x28] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x28]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x29] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x29]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x2a] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x2a]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x2b] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x2b]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x2c] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x2c]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x2d] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x2d]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x2e] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x2e]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x2f] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x2f]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x30] + lVar95];
        iVar124 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x30]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar167 = s->bsLive;
            iVar118 = iVar167 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar167);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar124 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
        bVar82 = (*paUVar1)[(ulong)pUVar96[(long)iVar120 + 0x31] + lVar95];
        iVar120 = s->code[0][uVar97 * 2 + uVar93 * 0x100 + (ulong)pUVar96[(long)iVar120 + 0x31]];
        if (7 < iVar118) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar124 = s->bsLive;
            iVar118 = iVar124 + -8;
            s->bsLive = iVar118;
          } while (0xf < iVar124);
        }
        iVar118 = iVar118 + (uint)bVar82;
        s->bsBuff = s->bsBuff | iVar120 << (-(char)iVar118 & 0x1fU);
        s->bsLive = iVar118;
      }
      iVar120 = iVar85 + 1;
      lVar86 = lVar86 + 1;
      iVar118 = s->nMTF;
    } while (iVar120 < iVar118);
  }
  if ((int)lVar86 != local_1a8._0_4_) {
    BZ2_bz__AssertH__fail(0xbbf);
  }
  is_last_block = (Bool)local_16c;
  if (2 < s->verbosity) {
    fprintf(_stderr,"codes %d\n",(ulong)(uint)(s->numZ - iVar83));
  }
LAB_0010a537:
  if (is_last_block != '\0') {
    bsPutUChar(s,'\x17');
    bsPutUChar(s,'r');
    bsPutUChar(s,'E');
    bsPutUChar(s,'8');
    bsPutUChar(s,'P');
    bsPutUChar(s,0x90);
    bsPutUInt32(s,s->combinedCRC);
    if (1 < s->verbosity) {
      BZ2_compressBlock_cold_2();
    }
    if (0 < s->bsLive) {
      do {
        s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
        s->numZ = s->numZ + 1;
        s->bsBuff = s->bsBuff << 8;
        iVar83 = s->bsLive;
        s->bsLive = iVar83 + -8;
      } while (8 < iVar83);
    }
  }
  return;
}

Assistant:

void BZ2_compressBlock ( EState* s, Bool is_last_block )
{
   if (s->nblock > 0) {

      BZ_FINALISE_CRC ( s->blockCRC );
      s->combinedCRC = (s->combinedCRC << 1) | (s->combinedCRC >> 31);
      s->combinedCRC ^= s->blockCRC;
      if (s->blockNo > 1) s->numZ = 0;

      if (s->verbosity >= 2)
         VPrintf4( "    block %d: crc = 0x%08x, "
                   "combined CRC = 0x%08x, size = %d\n",
                   s->blockNo, s->blockCRC, s->combinedCRC, s->nblock );

      BZ2_blockSort ( s );
   }

   s->zbits = (UChar*) (&((UChar*)s->arr2)[s->nblock]);

   /*-- If this is the first block, create the stream header. --*/
   if (s->blockNo == 1) {
      BZ2_bsInitWrite ( s );
      bsPutUChar ( s, BZ_HDR_B );
      bsPutUChar ( s, BZ_HDR_Z );
      bsPutUChar ( s, BZ_HDR_h );
      bsPutUChar ( s, (UChar)(BZ_HDR_0 + s->blockSize100k) );
   }

   if (s->nblock > 0) {

      bsPutUChar ( s, 0x31 ); bsPutUChar ( s, 0x41 );
      bsPutUChar ( s, 0x59 ); bsPutUChar ( s, 0x26 );
      bsPutUChar ( s, 0x53 ); bsPutUChar ( s, 0x59 );

      /*-- Now the block's CRC, so it is in a known place. --*/
      bsPutUInt32 ( s, s->blockCRC );

      /*--
         Now a single bit indicating (non-)randomisation.
         As of version 0.9.5, we use a better sorting algorithm
         which makes randomisation unnecessary.  So always set
         the randomised bit to 'no'.  Of course, the decoder
         still needs to be able to handle randomised blocks
         so as to maintain backwards compatibility with
         older versions of bzip2.
      --*/
      bsW(s,1,0);

      bsW ( s, 24, s->origPtr );
      generateMTFValues ( s );
      sendMTFValues ( s );
   }


   /*-- If this is the last block, add the stream trailer. --*/
   if (is_last_block) {

      bsPutUChar ( s, 0x17 ); bsPutUChar ( s, 0x72 );
      bsPutUChar ( s, 0x45 ); bsPutUChar ( s, 0x38 );
      bsPutUChar ( s, 0x50 ); bsPutUChar ( s, 0x90 );
      bsPutUInt32 ( s, s->combinedCRC );
      if (s->verbosity >= 2)
         VPrintf1( "    final combined CRC = 0x%08x\n   ", s->combinedCRC );
      bsFinishWrite ( s );
   }
}